

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

void cmQtAutoGen::RccMergeOptions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *baseOpts,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newOpts,bool isQt5)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d1;
  undefined1 local_d0;
  allocator<char> local_cf;
  allocator<char> local_ce;
  allocator<char> local_cd [20];
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  undefined8 uStack_18;
  bool isQt5_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *newOpts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *baseOpts_local;
  
  local_19 = isQt5;
  uStack_18 = newOpts;
  newOpts_local = baseOpts;
  if (RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
      ::valueOpts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                 ::valueOpts_abi_cxx11_);
    if (iVar1 != 0) {
      local_d0 = 1;
      local_b8 = &local_b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"name",&local_b9);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_90,"root",local_cd);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_70,"compress",&local_ce);
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_50,"threshold",&local_cf);
      local_d0 = 0;
      local_30 = &local_b0;
      local_28 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_d1);
      __l._M_len = local_28;
      __l._M_array = local_30;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                ::valueOpts_abi_cxx11_,__l,&local_d1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_d1);
      local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
      do {
        local_128 = local_128 + -1;
        std::__cxx11::string::~string((string *)local_128);
      } while (local_128 != &local_b0);
      std::allocator<char>::~allocator(&local_cf);
      std::allocator<char>::~allocator(&local_ce);
      std::allocator<char>::~allocator(local_cd);
      std::allocator<char>::~allocator(&local_b9);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                    ::valueOpts_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                           ::valueOpts_abi_cxx11_);
    }
  }
  MergeOptions(newOpts_local,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)uStack_18,
               &RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                ::valueOpts_abi_cxx11_,(bool)(local_19 & 1));
  return;
}

Assistant:

void cmQtAutoGen::RccMergeOptions(std::vector<std::string>& baseOpts,
                                  std::vector<std::string> const& newOpts,
                                  bool isQt5)
{
  static std::vector<std::string> const valueOpts = { "name", "root",
                                                      "compress",
                                                      "threshold" };
  MergeOptions(baseOpts, newOpts, valueOpts, isQt5);
}